

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_filter.cpp
# Opt level: O3

void __thiscall
duckdb::DynamicTableFilterSet::PushFilter
          (DynamicTableFilterSet *this,PhysicalOperator *op,idx_t column_index,
          unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *filter)

{
  int iVar1;
  __node_base_ptr p_Var2;
  PhysicalOperator *__p;
  __uniq_ptr_impl<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_> *this_00;
  pointer *__ptr;
  __hash_code __code;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_68;
  optional_ptr<duckdb::TableFilterSet,_true> local_60;
  ColumnIndex local_58;
  key_type local_38;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    local_58.index = (idx_t)op;
    p_Var2 = ::std::
             _Hashtable<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<const_duckdb::PhysicalOperator>,_duckdb::ReferenceHashFunction<const_duckdb::PhysicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::_M_find_before_node
                       (&(this->filters)._M_h,(ulong)op % (this->filters)._M_h._M_bucket_count,
                        (key_type *)&local_58,(__hash_code)op);
    if ((p_Var2 == (__node_base_ptr)0x0) || (p_Var2->_M_nxt == (_Hash_node_base *)0x0)) {
      __p = (PhysicalOperator *)operator_new(0x30);
      (__p->children).
      super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__p->children).
      super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      *(undefined8 *)
       &(((map<unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
           *)&__p->_vptr_PhysicalOperator)->_M_t)._M_impl = 0;
      *(undefined8 *)&((_Rb_tree_header *)&__p->type)->_M_header = 0;
      (__p->children).
      super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)&__p->type;
      (__p->children).
      super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&__p->type;
      (__p->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_60.ptr = (TableFilterSet *)__p;
      local_58.index = (idx_t)__p;
      local_38._M_data = op;
      this_00 = (__uniq_ptr_impl<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>
                 *)::std::__detail::
                   _Map_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<const_duckdb::PhysicalOperator>,_duckdb::ReferenceHashFunction<const_duckdb::PhysicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<const_duckdb::PhysicalOperator>,_duckdb::ReferenceHashFunction<const_duckdb::PhysicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&this->filters,&local_38);
      ::std::__uniq_ptr_impl<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>::
      reset(this_00,(pointer)__p);
    }
    else {
      local_60.ptr = (TableFilterSet *)p_Var2->_M_nxt[2]._M_nxt;
    }
    optional_ptr<duckdb::TableFilterSet,_true>::CheckValid(&local_60);
    local_58.child_indexes.super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
    super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.child_indexes.super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
    super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.child_indexes.super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
    super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68._M_head_impl =
         (filter->super_unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>).
         _M_t.super___uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>.
         super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl;
    (filter->super_unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)._M_t.
    super___uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>.
    super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl = (TableFilter *)0x0;
    local_58.index = column_index;
    TableFilterSet::PushFilter
              (local_60.ptr,&local_58,
               (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *)
               &local_68);
    if (local_68._M_head_impl != (TableFilter *)0x0) {
      (*(local_68._M_head_impl)->_vptr_TableFilter[1])();
    }
    local_68._M_head_impl = (TableFilter *)0x0;
    ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::~vector
              (&local_58.child_indexes.
                super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>);
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

void DynamicTableFilterSet::PushFilter(const PhysicalOperator &op, idx_t column_index, unique_ptr<TableFilter> filter) {
	lock_guard<mutex> l(lock);
	auto entry = filters.find(op);
	optional_ptr<TableFilterSet> filter_ptr;
	if (entry == filters.end()) {
		auto filter_set = make_uniq<TableFilterSet>();
		filter_ptr = filter_set.get();
		filters[op] = std::move(filter_set);
	} else {
		filter_ptr = entry->second.get();
	}
	filter_ptr->PushFilter(ColumnIndex(column_index), std::move(filter));
}